

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdio_transporter.cpp
# Opt level: O2

void __thiscall lscpp::stdio_transporter::reserve(stdio_transporter *this,size_t size)

{
  bool bVar1;
  pointer __p;
  size_t sVar2;
  
  sVar2 = this->size_;
  bVar1 = false;
  while (sVar2 < size) {
    sVar2 = sVar2 * 2;
    this->size_ = sVar2;
    bVar1 = true;
  }
  if (bVar1) {
    __p = (pointer)operator_new__(sVar2);
    std::__uniq_ptr_impl<char,_std::default_delete<char[]>_>::reset
              ((__uniq_ptr_impl<char,_std::default_delete<char[]>_> *)&this->data_,__p);
    return;
  }
  return;
}

Assistant:

void stdio_transporter::reserve(std::size_t size) {
  bool reallocate = false;
  while (size > size_) {
    reallocate = true;
    size_ *= 2;
  }
  if (reallocate)
    data_.reset(new char[size_]);
}